

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_panel.cxx
# Opt level: O3

Fl_Double_Window * make_about_panel(void)

{
  uint *puVar1;
  Fl_Double_Window *this;
  int iVar2;
  Fl_Window *this_00;
  Fl_Box *pFVar3;
  Fl_Widget *this_01;
  Fl_Button *this_02;
  Fl_Return_Button *this_03;
  Fl_Pixmap *this_04;
  char about [80];
  char acStack_68 [80];
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,0x159,0xb4,"About FLUID");
  about_panel = (Fl_Double_Window *)this_00;
  (this_00->super_Fl_Group).super_Fl_Widget.color_ = 0x32;
  (this_00->super_Fl_Group).super_Fl_Widget.color2_ = 0x2f;
  Fl_Window::hotspot(this_00,(Fl_Widget *)this_00,0);
  pFVar3 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar3,10,10,0x73,0x78,(char *)0x0);
  if (image_fluid()::image == '\0') {
    iVar2 = __cxa_guard_acquire(&image_fluid()::image);
    if (iVar2 != 0) {
      this_04 = (Fl_Pixmap *)operator_new(0x38);
      Fl_Pixmap::Fl_Pixmap(this_04,idata_fluid);
      image_fluid()::image = this_04;
      __cxa_guard_release(&image_fluid()::image);
    }
  }
  (pFVar3->super_Fl_Widget).label_.image = &image_fluid()::image->super_Fl_Image;
  this_01 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)this_01,0x87,10,0xcd,0x4b,"FLTK User\nInterface Designer\nVersion x.x.x")
  ;
  this_01->color_ = 0xc;
  this_01->color2_ = 0x2f;
  (this_01->label_).font = 1;
  (this_01->label_).size = 0x12;
  (this_01->label_).align_ = 0x15;
  snprintf(acStack_68,0x50,"FLTK User\nInterface Designer\nVersion %d.%d.%d",1,3,4);
  Fl_Widget::copy_label(this_01,acStack_68);
  pFVar3 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar3,0x87,0x5a,200,0x2d,"Copyright 1998-2016 by\nBill Spitzak and others");
  (pFVar3->super_Fl_Widget).label_.align_ = 0x94;
  this_02 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_02,0x73,0x91,0x7b,0x19,"View License...");
  (this_02->super_Fl_Widget).label_.color = 0x88;
  (this_02->super_Fl_Widget).callback_ = cb_View;
  this_03 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(this_03,0xfa,0x91,0x53,0x19,"Close");
  (this_03->super_Fl_Button).super_Fl_Widget.callback_ = cb_Close;
  this = about_panel;
  puVar1 = &(about_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x20;
  Fl_Group::end((Fl_Group *)this);
  return about_panel;
}

Assistant:

Fl_Double_Window* make_about_panel() {
  { about_panel = new Fl_Double_Window(345, 180, "About FLUID");
    about_panel->color(FL_LIGHT1);
    about_panel->selection_color(FL_DARK1);
    about_panel->hotspot(about_panel);
    { Fl_Box* o = new Fl_Box(10, 10, 115, 120);
      o->image( image_fluid() );
    } // Fl_Box* o
    { Fl_Box* o = new Fl_Box(135, 10, 205, 75, "FLTK User\nInterface Designer\nVersion x.x.x");
      o->color((Fl_Color)12);
      o->selection_color(FL_DARK1);
      o->labelfont(1);
      o->labelsize(18);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      char about[80]; // uses less than 60
      snprintf(about,sizeof(about),"FLTK User\nInterface Designer\nVersion %d.%d.%d",FL_MAJOR_VERSION,FL_MINOR_VERSION,FL_PATCH_VERSION);
      o->copy_label(about);
    } // Fl_Box* o
    { Fl_Box* o = new Fl_Box(135, 90, 200, 45, "Copyright 1998-2016 by\nBill Spitzak and others");
      o->align(Fl_Align(132|FL_ALIGN_INSIDE));
    } // Fl_Box* o
    { Fl_Button* o = new Fl_Button(115, 145, 123, 25, "View License...");
      o->labelcolor(FL_DARK_BLUE);
      o->callback((Fl_Callback*)cb_View);
    } // Fl_Button* o
    { Fl_Return_Button* o = new Fl_Return_Button(250, 145, 83, 25, "Close");
      o->callback((Fl_Callback*)cb_Close);
    } // Fl_Return_Button* o
    about_panel->set_non_modal();
    about_panel->end();
  } // Fl_Double_Window* about_panel
  return about_panel;
}